

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

strbuf * aes256_decrypt_pubkey_wrapper(ptrlen key,ptrlen iv,ptrlen data)

{
  strbuf *psVar1;
  strbuf *sb;
  ptrlen data_local;
  ptrlen iv_local;
  ptrlen key_local;
  
  if (key.len != 0x20) {
    fatal_error("aes256_decrypt_pubkey: key must be 32 bytes long");
  }
  if (iv.len != 0x10) {
    fatal_error("aes256_encrypt_pubkey: iv must be 16 bytes long");
  }
  if (((undefined1  [16])data & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
    fatal_error("aes256_decrypt_pubkey: data must be a multiple of 16 bytes");
  }
  psVar1 = strbuf_dup(data);
  aes256_decrypt_pubkey(key.ptr,iv.ptr,psVar1->u,(int)psVar1->len);
  return psVar1;
}

Assistant:

strbuf *aes256_decrypt_pubkey_wrapper(ptrlen key, ptrlen iv, ptrlen data)
{
    if (key.len != 32)
        fatal_error("aes256_decrypt_pubkey: key must be 32 bytes long");
    if (iv.len != 16)
        fatal_error("aes256_encrypt_pubkey: iv must be 16 bytes long");
    if (data.len % 16 != 0)
        fatal_error("aes256_decrypt_pubkey: data must be a multiple of 16 bytes");
    strbuf *sb = strbuf_dup(data);
    aes256_decrypt_pubkey(key.ptr, iv.ptr, sb->u, sb->len);
    return sb;
}